

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.cpp
# Opt level: O3

size_t duckdb_zstd::HUF_compress1X_usingCTable_internal_bmi2
                 (void *dst,size_t dstSize,void *src,size_t srcSize,HUF_CElt *CTable)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong *puVar11;
  int iVar12;
  uint uVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  HUF_CStream_t bitC;
  HUF_CStream_t local_48;
  
  if (7 < dstSize) {
    local_48.bitPos[0] = 0;
    local_48.bitPos[1] = 0;
    local_48.bitContainer[0] = 0;
    local_48.bitContainer[1] = 0;
    local_48.endPtr = (BYTE *)((long)dst + (dstSize - 8));
    if (dstSize == 8) {
      sVar4 = 0;
    }
    else {
      uVar10 = (uint)*CTable & 0xff;
      uVar13 = (uint)srcSize;
      local_48.ptr = (BYTE *)dst;
      if (uVar10 < 0xc && ((*CTable & 0xff) * srcSize >> 3) + 8 <= dstSize) {
        switch(uVar10) {
        case 7:
          uVar10 = uVar13 + 7;
          if (-1 < (int)uVar13) {
            uVar10 = uVar13;
          }
          iVar12 = uVar13 - (uVar10 & 0xfffffff8);
          if (0 < iVar12) {
            pbVar14 = (byte *)((long)(int)uVar13 + (long)src);
            uVar13 = iVar12 + 1;
            uVar7 = 0;
            local_48.bitContainer[0] = 0;
            do {
              pbVar14 = pbVar14 + -1;
              uVar8 = CTable[(ulong)*pbVar14 + 1];
              uVar7 = uVar7 + uVar8;
              local_48.bitContainer[0] =
                   uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)dst = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
            local_48.ptr = (BYTE *)((long)dst + ((uVar7 & 0xff) >> 3));
          }
          uVar13 = (uint)srcSize;
          if ((srcSize & 0xf) != 0) {
            lVar5 = (long)(int)uVar13;
            lVar15 = 7;
            do {
              uVar7 = CTable[(ulong)*(byte *)((long)src + lVar15 + lVar5 + -8) + 1];
              local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar7;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar13 = uVar13 - 8;
            uVar7 = CTable[(ulong)*(byte *)((long)src + lVar5 + -8) + 1];
            uVar8 = local_48.bitPos[0] + uVar7;
            local_48.bitContainer[0] =
                 uVar7 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar7 & 0x3f);
            local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)local_48.ptr = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f)
            ;
            local_48.ptr = (BYTE *)((long)local_48.ptr + ((uVar8 & 0xff) >> 3));
          }
          if (0 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
            lVar5 = (long)src + (uVar7 - 1);
            lVar15 = (long)src + (uVar7 - 9);
            puVar11 = (ulong *)local_48.ptr;
            do {
              lVar6 = 7;
              do {
                uVar8 = CTable[(ulong)*(byte *)(lVar5 + -7 + lVar6) + 1];
                local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
                local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar8 = CTable[(ulong)*(byte *)((uVar7 - 8) + (long)src) + 1];
              local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
              uVar9 = uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              *puVar11 = uVar9 >> ((ulong)(byte)-(char)local_48.bitPos[0] & 0x3f);
              lVar6 = 7;
              uVar8 = 0;
              lVar16 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar15 + -7 + lVar6) + 1];
                uVar8 = uVar8 >> (uVar1 & 0x3f) | uVar1;
                lVar16 = lVar16 + uVar1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar3 = (local_48.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar7 - 0x10)) + 1];
              local_48.bitPos[1] = lVar16 + uVar1;
              local_48.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar8 >> (uVar1 & 0x3f);
              local_48.bitContainer[0] =
                   uVar9 >> (local_48.bitPos[1] & 0x3f) | local_48.bitContainer[1];
              uVar8 = local_48.bitPos[1] + ((uint)local_48.bitPos[0] & 7);
              local_48.ptr = (BYTE *)((long)puVar11 + ((uVar8 & 0xff) >> 3) + uVar3);
              local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
              *(size_t *)((long)puVar11 + uVar3) =
                   local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
              lVar5 = lVar5 + -0x10;
              lVar15 = lVar15 + -0x10;
              bVar2 = 0x10 < (long)uVar7;
              uVar7 = uVar7 - 0x10;
              puVar11 = (ulong *)local_48.ptr;
            } while (bVar2);
          }
          break;
        case 8:
          if (0 < (int)uVar13 % 7) {
            pbVar14 = (byte *)((long)(int)uVar13 + (long)src);
            uVar13 = (int)uVar13 % 7 + 1;
            uVar7 = 0;
            local_48.bitContainer[0] = 0;
            do {
              pbVar14 = pbVar14 + -1;
              uVar8 = CTable[(ulong)*pbVar14 + 1];
              uVar7 = uVar7 + uVar8;
              local_48.bitContainer[0] =
                   uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)dst = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
            local_48.ptr = (BYTE *)((long)dst + ((uVar7 & 0xff) >> 3));
          }
          uVar13 = (uint)srcSize;
          if (0x12492492 < (uVar13 * -0x49249249 + 0x12492492 >> 1 | uVar13 * -0x80000000)) {
            lVar5 = (long)(int)uVar13;
            lVar15 = 6;
            do {
              uVar7 = CTable[(ulong)*(byte *)((long)src + lVar15 + lVar5 + -7) + 1];
              local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar7;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar13 = uVar13 - 7;
            uVar7 = CTable[(ulong)*(byte *)((long)src + lVar5 + -7) + 1];
            uVar8 = local_48.bitPos[0] + uVar7;
            local_48.bitContainer[0] =
                 uVar7 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar7 & 0x3f);
            local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)local_48.ptr = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f)
            ;
            local_48.ptr = (BYTE *)((long)local_48.ptr + ((uVar8 & 0xff) >> 3));
          }
          if (0 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
            lVar5 = (long)src + (uVar7 - 1);
            lVar15 = (long)src + (uVar7 - 8);
            puVar11 = (ulong *)local_48.ptr;
            do {
              lVar6 = 6;
              do {
                uVar8 = CTable[(ulong)*(byte *)(lVar5 + -6 + lVar6) + 1];
                local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
                local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar8 = CTable[(ulong)*(byte *)((uVar7 - 7) + (long)src) + 1];
              local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
              uVar9 = uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              *puVar11 = uVar9 >> ((ulong)(byte)-(char)local_48.bitPos[0] & 0x3f);
              lVar6 = 6;
              uVar8 = 0;
              lVar16 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar15 + -6 + lVar6) + 1];
                uVar8 = uVar8 >> (uVar1 & 0x3f) | uVar1;
                lVar16 = lVar16 + uVar1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar3 = (local_48.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar7 - 0xe)) + 1];
              local_48.bitPos[1] = lVar16 + uVar1;
              local_48.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar8 >> (uVar1 & 0x3f);
              local_48.bitContainer[0] =
                   uVar9 >> (local_48.bitPos[1] & 0x3f) | local_48.bitContainer[1];
              uVar8 = local_48.bitPos[1] + ((uint)local_48.bitPos[0] & 7);
              local_48.ptr = (BYTE *)((long)puVar11 + ((uVar8 & 0xff) >> 3) + uVar3);
              local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
              *(size_t *)((long)puVar11 + uVar3) =
                   local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
              lVar5 = lVar5 + -0xe;
              lVar15 = lVar15 + -0xe;
              bVar2 = 0xe < (long)uVar7;
              uVar7 = uVar7 - 0xe;
              puVar11 = (ulong *)local_48.ptr;
            } while (bVar2);
          }
          break;
        case 9:
          if (0 < (int)uVar13 % 6) {
            pbVar14 = (byte *)((long)(int)uVar13 + (long)src);
            uVar13 = (int)uVar13 % 6 + 1;
            uVar7 = 0;
            local_48.bitContainer[0] = 0;
            do {
              pbVar14 = pbVar14 + -1;
              uVar8 = CTable[(ulong)*pbVar14 + 1];
              uVar7 = uVar7 + uVar8;
              local_48.bitContainer[0] =
                   uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)dst = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
            local_48.ptr = (BYTE *)((long)dst + ((uVar7 & 0xff) >> 3));
          }
          uVar13 = (uint)srcSize;
          if (0x15555554 < (uVar13 * -0x55555555 + 0x2aaaaaa8 >> 2 | uVar13 * -0x40000000)) {
            lVar5 = (long)(int)uVar13;
            lVar15 = 5;
            do {
              uVar7 = CTable[(ulong)*(byte *)((long)src + lVar15 + lVar5 + -6) + 1];
              local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar7;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar13 = uVar13 - 6;
            uVar7 = CTable[(ulong)*(byte *)((long)src + lVar5 + -6) + 1];
            uVar8 = local_48.bitPos[0] + uVar7;
            local_48.bitContainer[0] =
                 uVar7 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar7 & 0x3f);
            local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)local_48.ptr = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f)
            ;
            local_48.ptr = (BYTE *)((long)local_48.ptr + ((uVar8 & 0xff) >> 3));
          }
          if (0 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
            lVar5 = (long)src + (uVar7 - 1);
            lVar15 = (long)src + (uVar7 - 7);
            puVar11 = (ulong *)local_48.ptr;
            do {
              lVar6 = 5;
              do {
                uVar8 = CTable[(ulong)*(byte *)(lVar5 + -5 + lVar6) + 1];
                local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
                local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar8 = CTable[(ulong)*(byte *)((uVar7 - 6) + (long)src) + 1];
              local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
              uVar9 = uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              *puVar11 = uVar9 >> ((ulong)(byte)-(char)local_48.bitPos[0] & 0x3f);
              lVar6 = 5;
              uVar8 = 0;
              lVar16 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar15 + -5 + lVar6) + 1];
                uVar8 = uVar8 >> (uVar1 & 0x3f) | uVar1;
                lVar16 = lVar16 + uVar1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar3 = (local_48.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar7 - 0xc)) + 1];
              local_48.bitPos[1] = lVar16 + uVar1;
              local_48.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar8 >> (uVar1 & 0x3f);
              local_48.bitContainer[0] =
                   uVar9 >> (local_48.bitPos[1] & 0x3f) | local_48.bitContainer[1];
              uVar8 = local_48.bitPos[1] + ((uint)local_48.bitPos[0] & 7);
              local_48.ptr = (BYTE *)((long)puVar11 + ((uVar8 & 0xff) >> 3) + uVar3);
              local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
              *(size_t *)((long)puVar11 + uVar3) =
                   local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
              lVar5 = lVar5 + -0xc;
              lVar15 = lVar15 + -0xc;
              bVar2 = 0xc < (long)uVar7;
              uVar7 = uVar7 - 0xc;
              puVar11 = (ulong *)local_48.ptr;
            } while (bVar2);
          }
          break;
        case 10:
          if (0 < (int)uVar13 % 5) {
            pbVar14 = (byte *)((long)(int)uVar13 + (long)src);
            uVar13 = (int)uVar13 % 5 + 1;
            uVar7 = 0;
            local_48.bitContainer[0] = 0;
            do {
              pbVar14 = pbVar14 + -1;
              uVar8 = CTable[(ulong)*pbVar14 + 1];
              uVar7 = uVar7 + uVar8;
              local_48.bitContainer[0] =
                   uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)dst = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
            local_48.ptr = (BYTE *)((long)dst + ((uVar7 & 0xff) >> 3));
          }
          uVar13 = (uint)srcSize;
          if (0x19999998 < (uVar13 * -0x33333333 + 0x19999998 >> 1 | uVar13 * -0x80000000)) {
            lVar5 = (long)(int)uVar13;
            lVar15 = 4;
            do {
              uVar7 = CTable[(ulong)*(byte *)((long)src + lVar15 + lVar5 + -5) + 1];
              local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar7;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar13 = uVar13 - 5;
            uVar7 = CTable[(ulong)*(byte *)((long)src + lVar5 + -5) + 1];
            local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
            uVar7 = local_48.bitPos[0] + uVar7;
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)local_48.ptr = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f)
            ;
            local_48.ptr = (BYTE *)((long)local_48.ptr + ((uVar7 & 0xff) >> 3));
          }
          if (0 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
            lVar5 = (long)src + (uVar7 - 1);
            lVar15 = (long)src + (uVar7 - 6);
            puVar11 = (ulong *)local_48.ptr;
            do {
              lVar6 = 4;
              do {
                uVar8 = CTable[(ulong)*(byte *)(lVar5 + -4 + lVar6) + 1];
                local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
                local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar8 = CTable[(ulong)*(byte *)((uVar7 - 5) + (long)src) + 1];
              uVar9 = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
              *puVar11 = uVar9 >> ((ulong)(byte)-(char)local_48.bitPos[0] & 0x3f);
              lVar6 = 4;
              uVar8 = 0;
              lVar16 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar15 + -4 + lVar6) + 1];
                uVar8 = uVar8 >> (uVar1 & 0x3f) | uVar1;
                lVar16 = lVar16 + uVar1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar1 = (local_48.bitPos[0] & 0xff) >> 3;
              local_48.bitPos[1] = CTable[(ulong)*(byte *)((long)src + (uVar7 - 10)) + 1];
              local_48.bitContainer[1] = uVar8 >> (local_48.bitPos[1] & 0x3f) | local_48.bitPos[1];
              local_48.bitPos[1] = lVar16 + local_48.bitPos[1];
              local_48.bitContainer[0] =
                   uVar9 >> (local_48.bitPos[1] & 0x3f) | local_48.bitContainer[1];
              uVar8 = local_48.bitPos[1] + ((uint)local_48.bitPos[0] & 7);
              local_48.ptr = (BYTE *)((long)puVar11 + ((uVar8 & 0xff) >> 3) + uVar1);
              local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
              *(size_t *)((long)puVar11 + uVar1) =
                   local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
              lVar5 = lVar5 + -10;
              lVar15 = lVar15 + -10;
              bVar2 = 10 < (long)uVar7;
              uVar7 = uVar7 - 10;
              puVar11 = (ulong *)local_48.ptr;
            } while (bVar2);
          }
          break;
        case 0xb:
          if (0 < (int)uVar13 % 5) {
            pbVar14 = (byte *)((long)(int)uVar13 + (long)src);
            uVar13 = (int)uVar13 % 5 + 1;
            uVar7 = 0;
            local_48.bitContainer[0] = 0;
            do {
              pbVar14 = pbVar14 + -1;
              uVar8 = CTable[(ulong)*pbVar14 + 1];
              uVar7 = uVar7 + uVar8;
              local_48.bitContainer[0] =
                   uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)dst = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
            local_48.ptr = (BYTE *)((long)dst + ((uVar7 & 0xff) >> 3));
          }
          uVar13 = (uint)srcSize;
          if (0x19999998 < (uVar13 * -0x33333333 + 0x19999998 >> 1 | uVar13 * -0x80000000)) {
            lVar5 = (long)(int)uVar13;
            lVar15 = 4;
            do {
              uVar7 = CTable[(ulong)*(byte *)((long)src + lVar15 + lVar5 + -5) + 1];
              local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar7;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar13 = uVar13 - 5;
            uVar7 = CTable[(ulong)*(byte *)((long)src + lVar5 + -5) + 1];
            uVar8 = local_48.bitPos[0] + uVar7;
            local_48.bitContainer[0] =
                 uVar7 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar7 & 0x3f);
            local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
            *(size_t *)local_48.ptr = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f)
            ;
            local_48.ptr = (BYTE *)((long)local_48.ptr + ((uVar8 & 0xff) >> 3));
          }
          if (0 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
            lVar5 = (long)src + (uVar7 - 1);
            lVar15 = (long)src + (uVar7 - 6);
            puVar11 = (ulong *)local_48.ptr;
            do {
              lVar6 = 4;
              do {
                uVar8 = CTable[(ulong)*(byte *)(lVar5 + -4 + lVar6) + 1];
                local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
                local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar8 = CTable[(ulong)*(byte *)((uVar7 - 5) + (long)src) + 1];
              local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
              uVar9 = uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              *puVar11 = uVar9 >> ((ulong)(byte)-(char)local_48.bitPos[0] & 0x3f);
              lVar6 = 4;
              uVar8 = 0;
              lVar16 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar15 + -4 + lVar6) + 1];
                uVar8 = uVar8 >> (uVar1 & 0x3f) | uVar1;
                lVar16 = lVar16 + uVar1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar3 = (local_48.bitPos[0] & 0xff) >> 3;
              uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar7 - 10)) + 1];
              local_48.bitPos[1] = lVar16 + uVar1;
              local_48.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar8 >> (uVar1 & 0x3f);
              local_48.bitContainer[0] =
                   uVar9 >> (local_48.bitPos[1] & 0x3f) | local_48.bitContainer[1];
              uVar8 = local_48.bitPos[1] + ((uint)local_48.bitPos[0] & 7);
              local_48.ptr = (BYTE *)((long)puVar11 + ((uVar8 & 0xff) >> 3) + uVar3);
              local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
              *(size_t *)((long)puVar11 + uVar3) =
                   local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
              lVar5 = lVar5 + -10;
              lVar15 = lVar15 + -10;
              bVar2 = 10 < (long)uVar7;
              uVar7 = uVar7 - 10;
              puVar11 = (ulong *)local_48.ptr;
            } while (bVar2);
          }
          break;
        default:
          if (0 < (int)uVar13 % 9) {
            pbVar14 = (byte *)((long)(int)uVar13 + (long)src);
            uVar13 = (int)uVar13 % 9 + 1;
            uVar7 = 0;
            local_48.bitContainer[0] = 0;
            do {
              pbVar14 = pbVar14 + -1;
              uVar8 = CTable[(ulong)*pbVar14 + 1];
              uVar7 = uVar7 + uVar8;
              local_48.bitContainer[0] =
                   uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
              srcSize = (size_t)((int)srcSize - 1);
              uVar13 = uVar13 - 1;
            } while (1 < uVar13);
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)dst = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
            local_48.ptr = (BYTE *)((long)dst + ((uVar7 & 0xff) >> 3));
          }
          uVar13 = (uint)srcSize;
          if (0xe38e38e < (uVar13 * 0x38e38e39 + 0xe38e38e >> 1 | uVar13 * -0x80000000)) {
            lVar5 = (long)(int)uVar13;
            lVar15 = 8;
            do {
              uVar7 = CTable[(ulong)*(byte *)((long)src + lVar15 + lVar5 + -9) + 1];
              local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar7;
              lVar15 = lVar15 + -1;
            } while (lVar15 != 0);
            uVar13 = uVar13 - 9;
            uVar7 = CTable[(ulong)*(byte *)((long)src + lVar5 + -9) + 1];
            local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
            uVar7 = local_48.bitPos[0] + uVar7;
            local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
            *(size_t *)local_48.ptr = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f)
            ;
            local_48.ptr = (BYTE *)((long)local_48.ptr + ((uVar7 & 0xff) >> 3));
          }
          if (0 < (int)uVar13) {
            uVar7 = (ulong)uVar13;
            lVar5 = (long)src + (uVar7 - 1);
            lVar15 = (long)src + (uVar7 - 10);
            puVar11 = (ulong *)local_48.ptr;
            do {
              lVar6 = 8;
              do {
                uVar8 = CTable[(ulong)*(byte *)(lVar5 + -8 + lVar6) + 1];
                local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
                local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar8 = CTable[(ulong)*(byte *)((uVar7 - 9) + (long)src) + 1];
              uVar9 = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
              *puVar11 = uVar9 >> ((ulong)(byte)-(char)local_48.bitPos[0] & 0x3f);
              lVar6 = 8;
              uVar8 = 0;
              lVar16 = 0;
              do {
                uVar1 = CTable[(ulong)*(byte *)(lVar15 + -8 + lVar6) + 1];
                uVar8 = uVar8 >> (uVar1 & 0x3f) | uVar1;
                lVar16 = lVar16 + uVar1;
                lVar6 = lVar6 + -1;
              } while (lVar6 != 0);
              uVar1 = (local_48.bitPos[0] & 0xff) >> 3;
              local_48.bitPos[1] = CTable[(ulong)*(byte *)((long)src + (uVar7 - 0x12)) + 1];
              local_48.bitContainer[1] = uVar8 >> (local_48.bitPos[1] & 0x3f) | local_48.bitPos[1];
              local_48.bitPos[1] = lVar16 + local_48.bitPos[1];
              local_48.bitContainer[0] =
                   uVar9 >> (local_48.bitPos[1] & 0x3f) | local_48.bitContainer[1];
              uVar8 = local_48.bitPos[1] + ((uint)local_48.bitPos[0] & 7);
              local_48.ptr = (BYTE *)((long)puVar11 + ((uVar8 & 0xff) >> 3) + uVar1);
              local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
              *(size_t *)((long)puVar11 + uVar1) =
                   local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
              lVar5 = lVar5 + -0x12;
              lVar15 = lVar15 + -0x12;
              bVar2 = 0x12 < (long)uVar7;
              uVar7 = uVar7 - 0x12;
              puVar11 = (ulong *)local_48.ptr;
            } while (bVar2);
          }
        }
      }
      else {
        uVar10 = uVar13 + 3;
        if (-1 < (int)uVar13) {
          uVar10 = uVar13;
        }
        iVar12 = uVar13 - (uVar10 & 0xfffffffc);
        if (0 < iVar12) {
          pbVar14 = (byte *)((long)(int)uVar13 + (long)src);
          uVar13 = iVar12 + 1;
          uVar7 = 0;
          local_48.bitContainer[0] = 0;
          do {
            pbVar14 = pbVar14 + -1;
            uVar8 = CTable[(ulong)*pbVar14 + 1];
            uVar7 = uVar7 + uVar8;
            local_48.bitContainer[0] =
                 uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
            srcSize = (size_t)((int)srcSize - 1);
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
          local_48.bitPos[0] = (size_t)((uint)uVar7 & 7);
          local_48.ptr = (BYTE *)(((uVar7 & 0xff) >> 3) + (long)dst);
          if (local_48.endPtr < local_48.ptr) {
            local_48.ptr = local_48.endPtr;
          }
          *(size_t *)dst = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar7 & 0x3f);
        }
        uVar13 = (uint)srcSize;
        if ((srcSize & 7) != 0) {
          lVar5 = (long)(int)uVar13;
          lVar15 = 3;
          do {
            uVar7 = CTable[(ulong)*(byte *)((long)src + lVar15 + lVar5 + -4) + 1];
            local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar7 & 0x3f) | uVar7;
            local_48.bitPos[0] = local_48.bitPos[0] + uVar7;
            lVar15 = lVar15 + -1;
          } while (lVar15 != 0);
          uVar13 = uVar13 - 4;
          uVar7 = CTable[(ulong)*(byte *)((long)src + lVar5 + -4) + 1];
          uVar8 = local_48.bitPos[0] + uVar7;
          local_48.bitContainer[0] =
               uVar7 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar7 & 0x3f);
          local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
          puVar11 = (ulong *)(((uVar8 & 0xff) >> 3) + (long)local_48.ptr);
          if (local_48.endPtr < puVar11) {
            puVar11 = (ulong *)local_48.endPtr;
          }
          *(size_t *)local_48.ptr = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
          local_48.ptr = (BYTE *)puVar11;
        }
        if (0 < (int)uVar13) {
          uVar7 = (ulong)uVar13;
          lVar5 = (long)src + (uVar7 - 1);
          lVar15 = (long)src + (uVar7 - 5);
          do {
            lVar6 = 3;
            do {
              uVar8 = CTable[(ulong)*(byte *)(lVar5 + -3 + lVar6) + 1];
              local_48.bitContainer[0] = local_48.bitContainer[0] >> (uVar8 & 0x3f) | uVar8;
              local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            uVar8 = CTable[(ulong)*(byte *)((uVar7 - 4) + (long)src) + 1];
            local_48.bitPos[0] = local_48.bitPos[0] + uVar8;
            uVar8 = uVar8 & 0xffffffffffffff00 | local_48.bitContainer[0] >> (uVar8 & 0x3f);
            puVar11 = (ulong *)(((local_48.bitPos[0] & 0xff) >> 3) + (long)local_48.ptr);
            if (local_48.endPtr < puVar11) {
              puVar11 = (ulong *)local_48.endPtr;
            }
            *(ulong *)local_48.ptr = uVar8 >> ((ulong)(byte)-(char)local_48.bitPos[0] & 0x3f);
            lVar6 = 3;
            uVar9 = 0;
            lVar16 = 0;
            do {
              uVar1 = CTable[(ulong)*(byte *)(lVar15 + -3 + lVar6) + 1];
              uVar9 = uVar9 >> (uVar1 & 0x3f) | uVar1;
              lVar16 = lVar16 + uVar1;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            uVar1 = CTable[(ulong)*(byte *)((long)src + (uVar7 - 8)) + 1];
            local_48.bitPos[1] = lVar16 + uVar1;
            local_48.bitContainer[1] = uVar1 & 0xffffffffffffff00 | uVar9 >> (uVar1 & 0x3f);
            local_48.bitContainer[0] =
                 uVar8 >> (local_48.bitPos[1] & 0x3f) | local_48.bitContainer[1];
            uVar8 = local_48.bitPos[1] + ((uint)local_48.bitPos[0] & 7);
            local_48.bitPos[0] = (size_t)((uint)uVar8 & 7);
            local_48.ptr = (BYTE *)(((uVar8 & 0xff) >> 3) + (long)puVar11);
            if (local_48.endPtr < local_48.ptr) {
              local_48.ptr = local_48.endPtr;
            }
            *puVar11 = local_48.bitContainer[0] >> ((ulong)(byte)-(char)uVar8 & 0x3f);
            lVar5 = lVar5 + -8;
            lVar15 = lVar15 + -8;
            bVar2 = 8 < (long)uVar7;
            uVar7 = uVar7 - 8;
          } while (bVar2);
        }
      }
      local_48.startPtr = (BYTE *)dst;
      sVar4 = HUF_closeCStream(&local_48);
    }
    return sVar4;
  }
  return 0;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t
HUF_compress1X_usingCTable_internal_body(void* dst, size_t dstSize,
                                   const void* src, size_t srcSize,
                                   const HUF_CElt* CTable)
{
    U32 const tableLog = HUF_readCTableHeader(CTable).tableLog;
    HUF_CElt const* ct = CTable + 1;
    const BYTE* ip = (const BYTE*) src;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    HUF_CStream_t bitC;

    /* init */
    if (dstSize < 8) return 0;   /* not enough space to compress */
    { BYTE* op = ostart;
      size_t const initErr = HUF_initCStream(&bitC, op, (size_t)(oend-op));
      if (HUF_isError(initErr)) return 0; }

    if (dstSize < HUF_tightCompressBound(srcSize, (size_t)tableLog) || tableLog > 11)
        HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ MEM_32bits() ? 2 : 4, /* kFast */ 0, /* kLastFast */ 0);
    else {
        if (MEM_32bits()) {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10: ZSTD_FALLTHROUGH;
            case 9: ZSTD_FALLTHROUGH;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 2, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 7: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 3, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        } else {
            switch (tableLog) {
            case 11:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 10:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 5, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            case 9:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 6, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 8:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 7, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 7:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 8, /* kFastFlush */ 1, /* kLastFast */ 0);
                break;
            case 6: ZSTD_FALLTHROUGH;
            default:
                HUF_compress1X_usingCTable_internal_body_loop(&bitC, ip, srcSize, ct, /* kUnroll */ 9, /* kFastFlush */ 1, /* kLastFast */ 1);
                break;
            }
        }
    }
    assert(bitC.ptr <= bitC.endPtr);

    return HUF_closeCStream(&bitC);
}